

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_internal.h
# Opt level: O2

ImGuiDockContextPruneNodeData * __thiscall
ImPool<ImGuiDockContextPruneNodeData>::Add(ImPool<ImGuiDockContextPruneNodeData> *this)

{
  int i;
  int iVar1;
  ImGuiDockContextPruneNodeData *pIVar2;
  
  i = this->FreeIdx;
  if (i == (this->Buf).Size) {
    ImVector<ImGuiDockContextPruneNodeData>::resize(&this->Buf,i + 1);
    iVar1 = this->FreeIdx + 1;
  }
  else {
    pIVar2 = ImVector<ImGuiDockContextPruneNodeData>::operator[](&this->Buf,i);
    iVar1 = pIVar2->CountWindows;
  }
  this->FreeIdx = iVar1;
  pIVar2 = ImVector<ImGuiDockContextPruneNodeData>::operator[](&this->Buf,i);
  pIVar2->CountWindows = 0;
  pIVar2->CountChildWindows = 0;
  pIVar2->CountChildNodes = 0;
  pIVar2->RootId = 0;
  pIVar2 = ImVector<ImGuiDockContextPruneNodeData>::operator[](&this->Buf,i);
  return pIVar2;
}

Assistant:

T*          Add()                               { int idx = FreeIdx; if (idx == Buf.Size) { Buf.resize(Buf.Size + 1); FreeIdx++; } else { FreeIdx = *(int*)&Buf[idx]; } IM_PLACEMENT_NEW(&Buf[idx]) T(); return &Buf[idx]; }